

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.hpp
# Opt level: O2

void __thiscall mxx::requests::~requests(requests *this)

{
  pointer ppoVar1;
  pointer ppoVar2;
  
  this->_vptr_requests = (_func_int **)&PTR__requests_00166340;
  ppoVar1 = (this->m_requests).
            super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppoVar2 = (this->m_requests).
                 super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppoVar2 != ppoVar1; ppoVar2 = ppoVar2 + 1) {
    if (*ppoVar2 != (ompi_request_t *)&ompi_request_null) {
      MPI_Request_free(ppoVar2);
    }
  }
  std::_Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::~_Vector_base
            (&(this->m_requests).
              super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>);
  return;
}

Assistant:

virtual ~requests() {
        // TODO: just use waitall again?
        for (MPI_Request& r : m_requests) {
            if (r != MPI_REQUEST_NULL)
                MPI_Request_free(&r);
        }
    }